

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O1

Image * rw::readTGA(char *filename)

{
  uint8 uVar1;
  int iVar2;
  uint8 *puVar3;
  Image *this;
  uint uVar4;
  size_t __nbytes;
  void *__buf;
  uint depth;
  int iVar5;
  ulong uVar6;
  uint8 *puVar7;
  int iVar8;
  ulong uVar9;
  TGAHeader header;
  uint32 length;
  StreamMemory file;
  TGAHeader local_74;
  uint8 *local_60;
  uint32 local_54;
  StreamMemory local_50;
  
  puVar3 = getFileContents(filename,&local_54);
  local_50.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00148cd0;
  __nbytes = 0;
  StreamMemory::open(&local_50,(char *)puVar3,local_54);
  TGAHeader::read(&local_74,(int)&local_50,__buf,__nbytes);
  StreamMemory::seek(&local_50,(int)local_74.IDlen,1);
  if (local_74.colorMapType == '\0') {
    depth = (uint)local_74.depth;
  }
  else {
    depth = (uint)(0x10 < local_74.colorMapLength) * 4 + 4;
  }
  uVar6 = (ulong)(uint)(int)local_74.height;
  this = Image::create((int)local_74.width,(int)local_74.height,depth);
  Image::allocate(this);
  if (local_74.colorMapType == '\0') {
    puVar7 = (uint8 *)0x0;
  }
  else {
    puVar7 = this->palette;
  }
  local_60 = puVar3;
  if (puVar7 != (uint8 *)0x0) {
    uVar4 = 0x100;
    if (depth == 4) {
      uVar4 = 0x10;
    }
    if ((long)local_74.colorMapLength < 1) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar7[uVar9 * 4 + 2] = uVar1;
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar7[uVar9 * 4 + 1] = uVar1;
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar7[uVar9 * 4] = uVar1;
        puVar7[uVar9 * 4 + 3] = 0xff;
        if (local_74.colorMapType != '\0' && local_74.colorMapDepth == ' ') {
          uVar1 = Stream::readU8(&local_50.super_Stream);
          puVar7[uVar9 * 4 + 3] = uVar1;
        }
        uVar9 = uVar9 + 1;
      } while ((long)local_74.colorMapLength != uVar9);
    }
    if ((uint)uVar9 < uVar4) {
      uVar9 = uVar9 & 0xffffffff;
      do {
        puVar3 = puVar7 + uVar9 * 4;
        puVar3[0] = '\0';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = 0xff;
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
  }
  iVar5 = (int)uVar6;
  puVar3 = this->pixels;
  if ((local_74.descriptor & 0x20) == 0) {
    puVar3 = puVar3 + (long)this->stride * ((long)this->height + -1);
  }
  if (0 < this->height) {
    iVar8 = 0;
    do {
      if (0 < this->width) {
        iVar5 = 0;
        puVar7 = puVar3;
        do {
          switch(this->depth << 0x1e | this->depth - 4U >> 2) {
          case 0:
          case 1:
            uVar1 = Stream::readU8(&local_50.super_Stream);
            goto LAB_00112362;
          case 3:
            uVar1 = Stream::readU8(&local_50.super_Stream);
            *puVar7 = uVar1;
            uVar1 = Stream::readU8(&local_50.super_Stream);
            puVar7[1] = uVar1;
            break;
          case 5:
            uVar1 = Stream::readU8(&local_50.super_Stream);
            puVar7[2] = uVar1;
            uVar1 = Stream::readU8(&local_50.super_Stream);
            puVar7[1] = uVar1;
            uVar1 = Stream::readU8(&local_50.super_Stream);
LAB_00112362:
            *puVar7 = uVar1;
            break;
          case 7:
            uVar1 = Stream::readU8(&local_50.super_Stream);
            puVar7[2] = uVar1;
            uVar1 = Stream::readU8(&local_50.super_Stream);
            puVar7[1] = uVar1;
            uVar1 = Stream::readU8(&local_50.super_Stream);
            *puVar7 = uVar1;
            uVar1 = Stream::readU8(&local_50.super_Stream);
            puVar7[3] = uVar1;
          }
          puVar7 = puVar7 + this->bpp;
          iVar5 = iVar5 + 1;
        } while (iVar5 < this->width);
      }
      iVar5 = (int)uVar6;
      if ((local_74.descriptor & 0x20) == 0) {
        iVar2 = -this->stride;
      }
      else {
        iVar2 = this->stride;
      }
      puVar3 = puVar3 + iVar2;
      iVar8 = iVar8 + 1;
    } while (iVar8 < this->height);
  }
  StreamMemory::close(&local_50,iVar5);
  (*DAT_00149da0)(local_60);
  return this;
}

Assistant:

Image*
readTGA(const char *filename)
{
	TGAHeader header;
	Image *image;
	int depth = 0, palDepth = 0;
	uint32 length;
	uint8 *data = getFileContents(filename, &length);
	assert(data != nil);
	StreamMemory file;
	file.open(data, length);
	header.read(&file);

	assert(header.imageType == 1 || header.imageType == 2);
	file.seek(header.IDlen);
	if(header.colorMapType){
		assert(header.colorMapOrigin == 0);
		depth = (header.colorMapLength <= 16) ? 4 : 8;
		palDepth = header.colorMapDepth;
		assert(palDepth == 24 || palDepth == 32);
	}else{
		depth = header.depth;
		assert(depth == 16 || depth == 24 || depth == 32);
	}

	image = Image::create(header.width, header.height, depth);
	image->allocate();
	uint8 *palette = header.colorMapType ? image->palette : nil;
	uint8 (*color)[4] = nil;
	if(palette){
		int maxlen = depth == 4 ? 16 : 256;
		color = (uint8(*)[4])palette;
		int i;
		for(i = 0; i < header.colorMapLength; i++){
			color[i][2] = file.readU8();
			color[i][1] = file.readU8();
			color[i][0] = file.readU8();
			color[i][3] = 0xFF;
			if(palDepth == 32)
				color[i][3] = file.readU8();
		}
		for(; i < maxlen; i++){
			color[i][0] = color[i][1] = color[i][2] = 0;
			color[i][3] = 0xFF;
		}
	}

	uint8 *pixels = image->pixels;
	if(!(header.descriptor & 0x20))
		pixels += (image->height-1)*image->stride;
	for(int y = 0; y < image->height; y++){
		uint8 *line = pixels;
		for(int x = 0; x < image->width; x++){
			switch(image->depth){
			case 4:
			case 8:
				line[0] = file.readU8();
				break;
			case 16:
				line[0] = file.readU8();
				line[1] = file.readU8();
				break;
			case 24:
				line[2] = file.readU8();
				line[1] = file.readU8();
				line[0] = file.readU8();
				break;
			case 32:
				line[2] = file.readU8();
				line[1] = file.readU8();
				line[0] = file.readU8();
				line[3] = file.readU8();
				break;
			}
			line += image->bpp;
		}
		pixels += (header.descriptor&0x20) ?
		              image->stride : -image->stride;
	}

	file.close();
	rwFree(data);
	return image;
}